

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O1

ion_status_t oah_get(ion_hashmap_t *hash_map,ion_key_t key,ion_value_t value)

{
  int iVar1;
  int iVar2;
  ion_err_t iVar3;
  undefined8 in_RAX;
  ion_status_t iVar4;
  int loc;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar3 = oah_find_item_loc(hash_map,key,&local_14);
  iVar4.error = '\x01';
  iVar4._1_3_ = 0;
  iVar4.count = 0;
  if (iVar3 == '\0') {
    iVar1 = (hash_map->super).record.key_size;
    iVar2 = (hash_map->super).record.value_size;
    memcpy(value,hash_map->entry + (long)iVar1 + (long)(iVar1 + iVar2 + 1) * (long)local_14 + 1,
           (long)iVar2);
    iVar4.error = '\0';
    iVar4._1_3_ = 0;
    iVar4.count = 1;
  }
  return iVar4;
}

Assistant:

ion_status_t
oah_get(
	ion_hashmap_t	*hash_map,
	ion_key_t		key,
	ion_value_t		value
) {
	int loc;

	if (oah_find_item_loc(hash_map, key, &loc) == err_ok) {
#if ION_DEBUG
		printf("Item found at location %d\n", loc);
#endif

		int					data_length = hash_map->super.record.key_size + hash_map->super.record.value_size;
		ion_hash_bucket_t	*item		= (((ion_hash_bucket_t *) ((hash_map->entry + (data_length + SIZEOF(STATUS)) * loc))));

		/* *value				   = malloc(sizeof(char) * (hash_map->super.record.value_size)); */
		memcpy(value, (item->data + hash_map->super.record.key_size), hash_map->super.record.value_size);
		return ION_STATUS_OK(1);
	}
	else {
#if ION_DEBUG
		printf("Item not found in hash table.\n");
#endif
		return ION_STATUS_ERROR(err_item_not_found);
	}
}